

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O0

void vector_int(void)

{
  initializer_list<int> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [32];
  Assert local_1f8;
  outputter<std::vector<int,_std::allocator<int>_>_> local_1e8;
  stringstream local_1e0 [8];
  stringstream ss;
  ostream local_1d0 [399];
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> s;
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_40[2] = 2;
  local_40[3] = 0x9c;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  std::__cxx11::stringstream::stringstream(local_1e0);
  local_1e8 = UnitTests::stream_any<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_20);
  UnitTests::stream_any_details::operator<<(local_1d0,&local_1e8);
  UnitTests::Assert::Assert
            (&local_1f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
             ,0x62);
  std::__cxx11::stringstream::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (&local_1f8,(char (*) [15])"[0, 1, 2, 156]",local_218);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

TEST(vector_int)
{
    auto s  = std::vector<int>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}